

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_buffer.c
# Opt level: O1

int lj_cf_buffer_method_put(lua_State *L)

{
  cTValue *pcVar1;
  TValue *pTVar2;
  uint64_t uVar3;
  bool bVar4;
  SBufExt *sb;
  long lVar5;
  cTValue *pcVar6;
  ulong uVar7;
  ulong uVar8;
  TValue *o;
  long lVar9;
  long lVar10;
  
  sb = buffer_tobuf(L);
  (sb->L).ptr64 = (ulong)((uint)(sb->L).ptr64 & 7) | (ulong)L;
  lVar9 = (long)L->top - (long)L->base;
  lVar5 = lVar9 >> 3;
  if (1 < lVar5) {
    lVar10 = 1;
    do {
      uVar8 = L->base[lVar10].u64;
      uVar7 = (long)uVar8 >> 0x2f;
      if (uVar7 != 0xfffffffffffffffb) {
        o = L->base + lVar10;
        bVar4 = true;
        do {
          if (uVar7 < 0xfffffffffffffff2) {
            lj_strfmt_putfnum((SBuf *)sb,0xf000035,o->n);
            goto LAB_0013159a;
          }
          if ((uVar7 == 0xfffffffffffffff3) &&
             (uVar8 = uVar8 & 0x7fffffffffff, *(char *)(uVar8 + 10) == '\x03')) {
            if ((SBufExt *)(uVar8 + 0x30) == sb) {
              lj_err_arg(L,(int)lVar10 + 1,LJ_ERR_BUFFER_SELF);
            }
            lj_buf_putmem((SBuf *)sb,*(void **)(uVar8 + 0x58),
                          *(int *)(uVar8 + 0x30) - (int)*(void **)(uVar8 + 0x58));
            goto LAB_0013159a;
          }
          if (!bVar4) {
LAB_001315df:
            lj_err_argtype(L,(int)lVar10 + 1,"string/number/__tostring");
          }
          pcVar6 = lj_meta_lookup(L,o,MM_tostring);
          if (pcVar6->u64 == 0xffffffffffffffff) goto LAB_001315df;
          pcVar1 = L->top;
          L->top = pcVar1 + 1;
          *pcVar1 = *pcVar6;
          pTVar2 = L->top;
          L->top = pTVar2 + 1;
          *pTVar2 = *o;
          lua_call(L,1,1);
          o = L->base + lVar10;
          *o = L->top[-1];
          L->top = (TValue *)((long)L->base + lVar9);
          uVar8 = o->u64;
          uVar7 = (long)uVar8 >> 0x2f;
          bVar4 = false;
        } while (uVar7 != 0xfffffffffffffffb);
      }
      lj_buf_putstr((SBuf *)sb,(GCstr *)(uVar8 & 0x7fffffffffff));
LAB_0013159a:
      lVar10 = lVar10 + 1;
    } while (lVar10 != lVar5);
  }
  uVar3 = (L->glref).ptr64;
  L->top = L->base + 1;
  if (*(ulong *)(uVar3 + 0x18) <= *(ulong *)(uVar3 + 0x10)) {
    lj_gc_step(L);
  }
  return 1;
}

Assistant:

LJLIB_CF(buffer_method_put)		LJLIB_REC(.)
{
  SBufExt *sbx = buffer_tobufw(L);
  ptrdiff_t arg, narg = L->top - L->base;
  for (arg = 1; arg < narg; arg++) {
    cTValue *o = &L->base[arg], *mo = NULL;
  retry:
    if (tvisstr(o)) {
      lj_buf_putstr((SBuf *)sbx, strV(o));
    } else if (tvisint(o)) {
      lj_strfmt_putint((SBuf *)sbx, intV(o));
    } else if (tvisnum(o)) {
      lj_strfmt_putfnum((SBuf *)sbx, STRFMT_G14, numV(o));
    } else if (tvisbuf(o)) {
      SBufExt *sbx2 = bufV(o);
      if (sbx2 == sbx) lj_err_arg(L, (int)(arg+1), LJ_ERR_BUFFER_SELF);
      lj_buf_putmem((SBuf *)sbx, sbx2->r, sbufxlen(sbx2));
    } else if (!mo && !tvisnil(mo = lj_meta_lookup(L, o, MM_tostring))) {
      /* Call __tostring metamethod inline. */
      copyTV(L, L->top++, mo);
      copyTV(L, L->top++, o);
      lua_call(L, 1, 1);
      o = &L->base[arg];  /* The stack may have been reallocated. */
      copyTV(L, &L->base[arg], L->top-1);
      L->top = L->base + narg;
      goto retry;  /* Retry with the result. */
    } else {
      lj_err_argtype(L, (int)(arg+1), "string/number/__tostring");
    }
    /* Probably not useful to inline other __tostring MMs, e.g. FFI numbers. */
  }
  L->top = L->base+1;  /* Chain buffer object. */
  lj_gc_check(L);
  return 1;
}